

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# readPDBrecs.c
# Opt level: O3

void parseSegID(char *line,char *id)

{
  uint uVar1;
  size_t sVar2;
  char cVar3;
  
  sVar2 = strlen(line);
  uVar1 = (uint)sVar2;
  if ((int)uVar1 < 0x49) {
    *id = ' ';
LAB_00123e0f:
    id[1] = ' ';
  }
  else {
    *id = line[0x48];
    if (uVar1 == 0x49) goto LAB_00123e0f;
    id[1] = line[0x49];
    if (0x4a < uVar1) {
      id[2] = line[0x4a];
      cVar3 = ' ';
      if (uVar1 != 0x4b) {
        cVar3 = line[0x4b];
      }
      goto LAB_00123e19;
    }
  }
  id[2] = ' ';
  cVar3 = ' ';
LAB_00123e19:
  id[3] = cVar3;
  id[4] = '\0';
  return;
}

Assistant:

void parseSegID(char *line, char id[]) {
   int reclen = strlen(line);
   id[0] = (reclen >= 73) ? line[72] : ' ';
   id[1] = (reclen >= 74) ? line[73] : ' ';
   id[2] = (reclen >= 75) ? line[74] : ' ';
   id[3] = (reclen >= 76) ? line[75] : ' ';
   id[4] = '\0';
}